

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

void CheckStopped(AActor *self)

{
  player_t *ppVar1;
  bool bVar2;
  
  ppVar1 = self->player;
  if (((ppVar1 != (player_t *)0x0) && (ppVar1->mo == (APlayerPawn *)self)) &&
     ((ppVar1->cheats & 0x2000) == 0)) {
    bVar2 = TVector3<double>::isZero(&self->Vel);
    if (!bVar2) {
      APlayerPawn::PlayIdle(self->player->mo);
      ppVar1 = self->player;
      (ppVar1->Vel).X = 0.0;
      (ppVar1->Vel).Y = 0.0;
    }
  }
  return;
}

Assistant:

static void CheckStopped(AActor *self)
{
	if (self->player != NULL &&
		self->player->mo == self &&
		!(self->player->cheats & CF_PREDICTING) && !self->Vel.isZero())
	{
		self->player->mo->PlayIdle();
		self->player->Vel.Zero();
	}
}